

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

bool duckdb::CSVMultiFileInfo::TryInitializeScan
               (ClientContext *context,shared_ptr<duckdb::BaseFileReader,_true> *reader,
               GlobalTableFunctionState *gstate_p,LocalTableFunctionState *lstate_p)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  pointer *__ptr;
  shared_ptr<duckdb::CSVFileScan,_true> csv_reader_ptr;
  _Head_base<0UL,_duckdb::StringValueScanner_*,_false> local_48;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  ::std::__shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,(__shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2> *)reader);
  shared_ptr_cast<duckdb::BaseFileReader,duckdb::CSVFileScan>
            ((shared_ptr<duckdb::BaseFileReader,_true> *)(local_40 + 8));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  local_48._M_head_impl = (StringValueScanner *)lstate_p[1]._vptr_LocalTableFunctionState;
  lstate_p[1]._vptr_LocalTableFunctionState = (_func_int **)0x0;
  CSVGlobalState::FinishScan
            ((CSVGlobalState *)gstate_p,
             (unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              *)&local_48);
  if (local_48._M_head_impl != (StringValueScanner *)0x0) {
    (*((local_48._M_head_impl)->super_BaseScanner)._vptr_BaseScanner[1])();
  }
  local_48._M_head_impl = (StringValueScanner *)0x0;
  CSVGlobalState::Next((CSVGlobalState *)local_40,(shared_ptr<duckdb::CSVFileScan,_true> *)gstate_p)
  ;
  uVar2 = local_40._0_8_;
  local_40._0_8_ = (_func_int **)0x0;
  pp_Var1 = lstate_p[1]._vptr_LocalTableFunctionState;
  lstate_p[1]._vptr_LocalTableFunctionState = (_func_int **)uVar2;
  if (pp_Var1 != (_func_int **)0x0) {
    (**(code **)(*pp_Var1 + 8))();
    if ((_func_int **)local_40._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_40._0_8_ + 8))();
    }
  }
  pp_Var1 = lstate_p[1]._vptr_LocalTableFunctionState;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return pp_Var1 != (_func_int **)0x0;
}

Assistant:

bool CSVMultiFileInfo::TryInitializeScan(ClientContext &context, shared_ptr<BaseFileReader> &reader,
                                         GlobalTableFunctionState &gstate_p, LocalTableFunctionState &lstate_p) {
	auto &gstate = gstate_p.Cast<CSVGlobalState>();
	auto &lstate = lstate_p.Cast<CSVLocalState>();
	auto csv_reader_ptr = shared_ptr_cast<BaseFileReader, CSVFileScan>(reader);
	gstate.FinishScan(std::move(lstate.csv_reader));
	lstate.csv_reader = gstate.Next(csv_reader_ptr);
	if (!lstate.csv_reader) {
		// exhausted the scan
		return false;
	}
	return true;
}